

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall
pbrt::RealisticCamera::RenderExitPupil(RealisticCamera *this,Float sx,Float sy,char *filename)

{
  undefined8 uVar1;
  size_t sVar2;
  LensElementInterface *pLVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Allocator alloc;
  int y;
  long lVar6;
  int x;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  Float value;
  undefined1 auVar11 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  allocator<char> local_29d;
  Float local_29c;
  aligned_storage_t<sizeof(float),_alignof(float)> local_298;
  float local_294;
  char *local_290;
  string local_288;
  undefined1 local_268 [16];
  ColorEncodingHandle local_250;
  aligned_storage_t<sizeof(float),_alignof(float)> local_248;
  float fStack_244;
  undefined1 auStack_240 [64];
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_1b8;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  optional<int> oStack_198;
  optional<float> oStack_190;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_188;
  undefined8 uStack_180;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_178;
  Image image;
  undefined1 extraout_var [60];
  
  local_29c = sy;
  local_298 = (aligned_storage_t<sizeof(float),_alignof(float)>)sx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"Y",(allocator<char> *)&local_288);
  local_250.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  local_290 = filename;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 1;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_248;
  Image::Image(&image,Float,(Point2i)0x80000000800,channels,&local_250,alloc);
  std::__cxx11::string::~string((string *)&local_248);
  lVar8 = 0;
  for (lVar6 = 0; lVar6 != 0x800; lVar6 = lVar6 + 1) {
    fVar9 = (float)(int)lVar6 / 2047.0;
    lVar7 = 0;
    fVar10 = (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].apertureRadius;
    auVar4 = vfnmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar10)),ZEXT416((uint)fVar10),
                              ZEXT416((uint)(1.0 - fVar9)));
    fVar10 = auVar4._0_4_;
    local_294 = fVar10 * fVar10;
    local_268 = ZEXT416((uint)(fVar10 - local_29c));
    for (; lVar7 != 0x800; lVar7 = lVar7 + 1) {
      fVar9 = (float)(int)lVar7 / 2047.0;
      sVar2 = (this->elementInterfaces).nStored;
      pLVar3 = (this->elementInterfaces).ptr;
      value = 1.0;
      fVar10 = pLVar3[sVar2 - 1].apertureRadius;
      auVar5 = vfnmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar10)),ZEXT416((uint)fVar10),
                                ZEXT416((uint)(1.0 - fVar9)));
      auVar4 = vfmadd213ss_fma(auVar5,auVar5,ZEXT416((uint)local_294));
      if (auVar4._0_4_ <= fVar10 * fVar10) {
        auStack_240._12_4_ = pLVar3[sVar2 - 1].thickness;
        auVar4 = vinsertps_avx(ZEXT416((uint)(auVar5._0_4_ - (float)local_298)),
                               ZEXT416((uint)local_268._0_4_),0x10);
        fStack_244 = local_29c;
        local_248 = local_298;
        auStack_240._0_4_ = (anon_struct_4_0_00000001_for___align)0x0;
        uVar1 = vmovlps_avx(auVar4);
        auStack_240._4_4_ = (undefined4)uVar1;
        auStack_240._8_4_ = (undefined4)((ulong)uVar1 >> 0x20);
        auStack_240._16_8_ = auStack_240._16_8_ & 0xffffffff00000000;
        auStack_240._24_8_ = 0;
        auVar11._0_4_ = TraceLensesFromFilm(this,(Ray *)&local_248,(Ray *)0x0);
        auVar11._4_60_ = extraout_var;
        uVar1 = vcmpss_avx512f(auVar11._0_16_,ZEXT416(0),4);
        value = (Float)((uint)((byte)uVar1 & 1) * 0x3f000000);
      }
      Image::SetChannel(&image,(Point2i)(lVar8 + lVar7),0,value);
    }
    lVar8 = lVar8 + 0x100000000;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,local_290,&local_29d);
  _Stack_178.super__Rb_tree_header._M_header._M_left = &_Stack_178.super__Rb_tree_header._M_header;
  aStack_188 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
  uStack_180._0_1_ = false;
  uStack_180._1_7_ = 0;
  _Stack_178._0_8_ = 0;
  _Stack_178.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_178.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_178.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  aStack_1b8._0_8_ = 0;
  aStack_1b8._8_8_ = 0;
  uStack_1a8 = 0;
  local_1a0 = 0;
  oStack_198.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  oStack_198.set = false;
  oStack_198._5_3_ = 0;
  oStack_190.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  oStack_190.set = false;
  oStack_190._5_3_ = 0;
  auStack_240._56_8_ = 0;
  uStack_200 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1d8 = 0;
  uStack_1d0 = 0;
  local_248 = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  fStack_244._0_1_ = false;
  fStack_244._1_3_ = 0;
  auStack_240._0_4_ = (anon_struct_4_0_00000001_for___align)0x0;
  auStack_240._4_4_ = 0.0;
  auStack_240._8_4_ = 0;
  auStack_240._12_4_ = 0;
  auStack_240._16_8_ = 0;
  auStack_240._24_8_ = 0;
  auStack_240._32_8_ = 0;
  auStack_240._40_8_ = 0;
  auStack_240._48_8_ = 0;
  _Stack_178.super__Rb_tree_header._M_node_count = 0;
  _Stack_178.super__Rb_tree_header._M_header._M_right =
       _Stack_178.super__Rb_tree_header._M_header._M_left;
  Image::Write(&image,&local_288,(ImageMetadata *)&local_248);
  ImageMetadata::~ImageMetadata((ImageMetadata *)&local_248);
  std::__cxx11::string::~string((string *)&local_288);
  Image::~Image(&image);
  return;
}

Assistant:

void RealisticCamera::RenderExitPupil(Float sx, Float sy, const char *filename) const {
    Point3f pFilm(sx, sy, 0);

    const int nSamples = 2048;
    Image image(PixelFormat::Float, {nSamples, nSamples}, {"Y"});

    for (int y = 0; y < nSamples; ++y) {
        Float fy = (Float)y / (Float)(nSamples - 1);
        Float ly = Lerp(fy, -RearElementRadius(), RearElementRadius());
        for (int x = 0; x < nSamples; ++x) {
            Float fx = (Float)x / (Float)(nSamples - 1);
            Float lx = Lerp(fx, -RearElementRadius(), RearElementRadius());

            Point3f pRear(lx, ly, LensRearZ());

            if (lx * lx + ly * ly > RearElementRadius() * RearElementRadius())
                image.SetChannel({x, y}, 0, 1.);
            else if (TraceLensesFromFilm(Ray(pFilm, pRear - pFilm), nullptr))
                image.SetChannel({x, y}, 0, 0.5);
            else
                image.SetChannel({x, y}, 0, 0.);
        }
    }

    image.Write(filename);
}